

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O3

bool tchecker::zg::shared_is_le(state_t *s1,state_t *s2)

{
  long lVar1;
  bool bVar2;
  overflow_error *poVar3;
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
  local_20;
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
  local_18;
  
  bVar2 = ta::shared_equal_to(&s1->super_state_t,&s2->super_state_t);
  if (bVar2) {
    local_18._t = (s1->_zone)._t;
    if ((&(local_18._t)->super_zone_t != (zone_t *)0x0) &&
       (lVar1 = *(long *)(&(local_18._t)->super_zone_t + -2),
       *(long *)(&(local_18._t)->super_zone_t + -2) = lVar1 + 1, lVar1 + 1 == -2)) {
      poVar3 = (overflow_error *)__cxa_allocate_exception(0x10);
      std::overflow_error::overflow_error(poVar3,"reference counter overflow");
      __cxa_throw(poVar3,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
    }
    local_20._t = (s2->_zone)._t;
    if ((&(local_20._t)->super_zone_t != (zone_t *)0x0) &&
       (lVar1 = *(long *)(&(local_20._t)->super_zone_t + -2),
       *(long *)(&(local_20._t)->super_zone_t + -2) = lVar1 + 1, lVar1 + 1 == -2)) {
      poVar3 = (overflow_error *)__cxa_allocate_exception(0x10);
      std::overflow_error::overflow_error(poVar3,"reference counter overflow");
      __cxa_throw(poVar3,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
    }
    if (local_18._t == local_20._t) {
      bVar2 = true;
    }
    else {
      if ((&(local_18._t)->super_zone_t == (zone_t *)0x0) ||
         (&(local_20._t)->super_zone_t == (zone_t *)0x0)) {
        __assert_fail("_t != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                      ,0x1d0,
                      "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t>>::operator*() const [T = tchecker::make_shared_t<tchecker::zg::zone_t>]"
                     );
      }
      bVar2 = zone_t::operator<=(&(local_18._t)->super_zone_t,&(local_20._t)->super_zone_t);
    }
    intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t(&local_20);
    intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t(&local_18);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool shared_is_le(tchecker::zg::state_t const & s1, tchecker::zg::state_t const & s2)
{
  return tchecker::ta::shared_equal_to(s1, s2) && (s1.zone_ptr() == s2.zone_ptr() || s1.zone() <= s2.zone());
}